

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error ft_stroker_add_reverse_left(SW_FT_Stroker stroker,SW_FT_Bool open)

{
  undefined8 *puVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  byte *pbVar5;
  char in_SIL;
  long in_RDI;
  SW_FT_Byte ttag;
  SW_FT_Byte *src_tag;
  SW_FT_Vector *src_point;
  SW_FT_Byte *dst_tag;
  SW_FT_Vector *dst_point;
  SW_FT_Error error;
  SW_FT_Int new_points;
  SW_FT_StrokeBorder left;
  SW_FT_StrokeBorder right;
  undefined8 in_stack_ffffffffffffffb8;
  SW_FT_StrokeBorder in_stack_ffffffffffffffc0;
  undefined8 *puVar6;
  byte *local_38;
  undefined8 *local_30;
  SW_FT_Error local_28;
  
  puVar3 = (uint *)(in_RDI + 0x70);
  puVar4 = (uint *)(in_RDI + 0x98);
  local_28 = 0;
  iVar2 = *puVar4 - *(int *)(in_RDI + 0xb4);
  if ((0 < iVar2) &&
     (local_28 = ft_stroke_border_grow
                           (in_stack_ffffffffffffffc0,
                            (SW_FT_UInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20)), local_28 == 0))
  {
    local_30 = (undefined8 *)(*(long *)(in_RDI + 0x78) + (ulong)*puVar3 * 0x10);
    local_38 = (byte *)(*(long *)(in_RDI + 0x80) + (ulong)*puVar3);
    pbVar5 = (byte *)(*(long *)(in_RDI + 0xa8) + (ulong)*puVar4);
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 0xa0) + (ulong)*puVar4 * 0x10);
    while( true ) {
      puVar6 = puVar1 + -2;
      pbVar5 = pbVar5 + -1;
      if (puVar6 < (undefined8 *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_RDI + 0xb4) * 0x10))
      break;
      *local_30 = *puVar6;
      local_30[1] = puVar1[-1];
      *local_38 = *pbVar5;
      if (in_SIL == '\0') {
        if (((*local_38 & 0xc) == 4) || ((*local_38 & 0xc) == 8)) {
          *local_38 = *local_38 ^ 0xc;
        }
      }
      else {
        *local_38 = *local_38 & 0xf3;
      }
      local_30 = local_30 + 2;
      local_38 = local_38 + 1;
      puVar1 = puVar6;
    }
    *puVar4 = *(uint *)(in_RDI + 0xb4);
    *puVar3 = iVar2 + *puVar3;
    *(undefined1 *)(in_RDI + 0x88) = 0;
    *(undefined1 *)(in_RDI + 0xb0) = 0;
  }
  return local_28;
}

Assistant:

static SW_FT_Error ft_stroker_add_reverse_left(SW_FT_Stroker stroker,
                                               SW_FT_Bool    open)
{
    SW_FT_StrokeBorder right = stroker->borders + 0;
    SW_FT_StrokeBorder left = stroker->borders + 1;
    SW_FT_Int          new_points;
    SW_FT_Error        error = 0;

    assert(left->start >= 0);

    new_points = left->num_points - left->start;
    if (new_points > 0) {
        error = ft_stroke_border_grow(right, (SW_FT_UInt)new_points);
        if (error) goto Exit;

        {
            SW_FT_Vector* dst_point = right->points + right->num_points;
            SW_FT_Byte*   dst_tag = right->tags + right->num_points;
            SW_FT_Vector* src_point = left->points + left->num_points - 1;
            SW_FT_Byte*   src_tag = left->tags + left->num_points - 1;

            while (src_point >= left->points + left->start) {
                *dst_point = *src_point;
                *dst_tag = *src_tag;

                if (open)
                    dst_tag[0] &= ~SW_FT_STROKE_TAG_BEGIN_END;
                else {
                    SW_FT_Byte ttag =
                        (SW_FT_Byte)(dst_tag[0] & SW_FT_STROKE_TAG_BEGIN_END);

                    /* switch begin/end tags if necessary */
                    if (ttag == SW_FT_STROKE_TAG_BEGIN ||
                        ttag == SW_FT_STROKE_TAG_END)
                        dst_tag[0] ^= SW_FT_STROKE_TAG_BEGIN_END;
                }

                src_point--;
                src_tag--;
                dst_point++;
                dst_tag++;
            }
        }

        left->num_points = left->start;
        right->num_points += new_points;

        right->movable = FALSE;
        left->movable = FALSE;
    }

Exit:
    return error;
}